

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void input(State *state)

{
  Timeline local_b0;
  rep local_78;
  rep local_70;
  Clock<1> local_61;
  rep local_60;
  microseconds updateAt;
  double tempo;
  Timeline timeLine;
  char in;
  State *state_local;
  
  timeLine.mTimeline.timeOrigin.__r._7_1_ = std::istream::get();
  ableton::Link::captureAppTimeline((Timeline *)&tempo,&state->link);
  updateAt.__r = (rep)ableton::Link::Timeline::tempo((Timeline *)&tempo);
  ableton::Link::clock(&state->link);
  local_60 = (rep)ableton::platforms::linux::Clock<1>::micros(&local_61);
  switch(timeLine.mTimeline.timeOrigin.__r._7_1_) {
  case 0x65:
    local_78 = local_60;
    ableton::Link::Timeline::setTempo
              ((Timeline *)&tempo,(double)updateAt.__r + 1.0,(microseconds)local_60);
    break;
  case 0x71:
    std::atomic<bool>::operator=(&state->running,false);
    clearLine();
    return;
  case 0x72:
    state->quantum = state->quantum - 1.0;
    break;
  case 0x74:
    state->quantum = state->quantum + 1.0;
    break;
  case 0x77:
    local_70 = local_60;
    ableton::Link::Timeline::setTempo
              ((Timeline *)&tempo,(double)updateAt.__r - 1.0,(microseconds)local_60);
  }
  memcpy(&local_b0,&tempo,0x38);
  ableton::Link::commitAppTimeline(&state->link,&local_b0);
  input(state);
  return;
}

Assistant:

void input(State& state)
{
  char in;

#if defined(LINK_PLATFORM_WINDOWS)
  HANDLE stdinHandle = GetStdHandle(STD_INPUT_HANDLE);
  DWORD numCharsRead;
  INPUT_RECORD inputRecord;
  do
  {
    ReadConsoleInput(stdinHandle, &inputRecord, 1, &numCharsRead);
  } while ((inputRecord.EventType != KEY_EVENT) || inputRecord.Event.KeyEvent.bKeyDown);
  in = inputRecord.Event.KeyEvent.uChar.AsciiChar;
#elif defined(LINK_PLATFORM_UNIX)
  in = std::cin.get();
#endif
  auto timeLine = state.link.captureAppTimeline();
  const auto tempo = timeLine.tempo();

  std::chrono::microseconds updateAt = state.link.clock().micros();

  switch (in)
  {
    case 'q':
      state.running = false;
      clearLine();
      return;
    case 'w':
      timeLine.setTempo(tempo-1,updateAt);
      break;
    case 'e':
      timeLine.setTempo(tempo+1,updateAt);
      break;
    case 'r':
      state.quantum -= 1;
      break;
    case 't':
      state.quantum += 1;
      break;
  }
  state.link.commitAppTimeline(timeLine);
  input(state);
}